

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_remove(REF_CELL ref_cell,REF_INT cell)

{
  uint uVar1;
  REF_INT *pRVar2;
  long lVar3;
  REF_STATUS RVar4;
  long lVar5;
  
  RVar4 = 3;
  if ((-1 < cell) && (cell < ref_cell->max)) {
    pRVar2 = ref_cell->c2n;
    lVar5 = (long)cell;
    lVar3 = ref_cell->size_per * lVar5;
    if (pRVar2[lVar3] != -1) {
      ref_cell->n = ref_cell->n + -1;
      if (0 < ref_cell->node_per) {
        lVar3 = 0;
        do {
          uVar1 = ref_adj_remove(ref_cell->ref_adj,ref_cell->c2n[ref_cell->size_per * lVar5 + lVar3]
                                 ,cell);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x315,"ref_cell_remove",(ulong)uVar1,"unregister cell");
            return uVar1;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < ref_cell->node_per);
        pRVar2 = ref_cell->c2n;
        lVar3 = ref_cell->size_per * lVar5;
      }
      pRVar2[lVar3] = -1;
      pRVar2[ref_cell->size_per * lVar5 + 1] = ref_cell->blank;
      ref_cell->blank = cell;
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_remove(REF_CELL ref_cell, REF_INT cell) {
  REF_INT node;
  if (!ref_cell_valid(ref_cell, cell)) return REF_INVALID;
  ref_cell_n(ref_cell)--;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_remove(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                       cell),
        "unregister cell");

  ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
  ref_cell_c2n(ref_cell, 1, cell) = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = cell;

  return REF_SUCCESS;
}